

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O1

int E_Stem(int type,int si1,int sj1,int extLoop,vrna_param_t *P)

{
  int iVar1;
  int (*paaiVar2) [5] [5];
  int iVar3;
  int iVar4;
  
  iVar1 = 0;
  iVar3 = 0;
  if (-1 < si1) {
    iVar3 = P->dangle5[type][(uint)si1];
  }
  if (-1 < sj1) {
    iVar1 = P->dangle3[type][(uint)sj1];
  }
  iVar4 = 0;
  if (2 < type) {
    iVar4 = P->TerminalAU;
  }
  if ((sj1 | si1) < 0) {
    iVar1 = iVar1 + iVar3;
  }
  else {
    paaiVar2 = P->mismatchExt;
    if (extLoop == 0) {
      paaiVar2 = P->mismatchM;
    }
    iVar1 = paaiVar2[type][(uint)si1][(uint)sj1];
  }
  iVar1 = iVar1 + iVar4;
  if (extLoop == 0) {
    iVar1 = iVar1 + P->MLintern[type];
  }
  return iVar1;
}

Assistant:

PUBLIC int
E_Stem(int          type,
       int          si1,
       int          sj1,
       int          extLoop,
       vrna_param_t *P)
{
  int energy  = 0;
  int d5      = (si1 >= 0) ? P->dangle5[type][si1] : 0;
  int d3      = (sj1 >= 0) ? P->dangle3[type][sj1] : 0;

  if (type > 2)
    energy += P->TerminalAU;

  if (si1 >= 0 && sj1 >= 0)
    energy += (extLoop) ? P->mismatchExt[type][si1][sj1] : P->mismatchM[type][si1][sj1];
  else
    energy += d5 + d3;

  if (!extLoop)
    energy += P->MLintern[type];

  return energy;
}